

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::SetFocusID(ImGuiID id,ImGuiWindow *window)

{
  ImRect *pIVar1;
  ImVec2 *pIVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  ImVec2 IVar5;
  ImGuiNavLayer IVar6;
  ImGuiContext *pIVar7;
  float fVar8;
  float fVar9;
  
  pIVar7 = GImGui;
  if (GImGui->NavWindow != window) {
    SetNavWindow(window);
  }
  IVar6 = (window->DC).NavLayerCurrent;
  pIVar7->NavId = id;
  pIVar7->NavLayer = IVar6;
  SetNavFocusScope(pIVar7->CurrentFocusScopeId);
  window->NavLastIds[IVar6] = id;
  if ((pIVar7->LastItemData).ID == id) {
    IVar3 = (window->DC).CursorStartPos;
    IVar4 = (pIVar7->LastItemData).NavRect.Min;
    IVar5 = (pIVar7->LastItemData).NavRect.Max;
    fVar8 = IVar3.x;
    fVar9 = IVar3.y;
    pIVar1 = window->NavRectRel + IVar6;
    (pIVar1->Min).x = IVar4.x - fVar8;
    (pIVar1->Min).y = IVar4.y - fVar9;
    (pIVar1->Max).x = IVar5.x - fVar8;
    (pIVar1->Max).y = IVar5.y - fVar9;
  }
  if ((pIVar7->ActiveIdSource & ~ImGuiInputSource_Mouse) == ImGuiInputSource_Keyboard) {
    pIVar7->NavDisableMouseHover = true;
  }
  else {
    pIVar7->NavDisableHighlight = true;
  }
  pIVar2 = GImGui->NavWindow->RootWindowForNav->NavPreferredScoringPosRel + GImGui->NavLayer;
  pIVar2->x = 3.4028235e+38;
  pIVar2->y = 3.4028235e+38;
  return;
}

Assistant:

void ImGui::SetFocusID(ImGuiID id, ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(id != 0);

    if (g.NavWindow != window)
       SetNavWindow(window);

    // Assume that SetFocusID() is called in the context where its window->DC.NavLayerCurrent and g.CurrentFocusScopeId are valid.
    // Note that window may be != g.CurrentWindow (e.g. SetFocusID call in InputTextEx for multi-line text)
    const ImGuiNavLayer nav_layer = window->DC.NavLayerCurrent;
    g.NavId = id;
    g.NavLayer = nav_layer;
    SetNavFocusScope(g.CurrentFocusScopeId);
    window->NavLastIds[nav_layer] = id;
    if (g.LastItemData.ID == id)
        window->NavRectRel[nav_layer] = WindowRectAbsToRel(window, g.LastItemData.NavRect);

    if (g.ActiveIdSource == ImGuiInputSource_Keyboard || g.ActiveIdSource == ImGuiInputSource_Gamepad)
        g.NavDisableMouseHover = true;
    else
        g.NavDisableHighlight = true;

    // Clear preferred scoring position (NavMoveRequestApplyResult() will tend to restore it)
    NavClearPreferredPosForAxis(ImGuiAxis_X);
    NavClearPreferredPosForAxis(ImGuiAxis_Y);
}